

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_StereoWidener.cpp
# Opt level: O0

int StereoWidener::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(3) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(3) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Amount","%",-10.0,10.0,1.0,100.0,1.0,0,
                    "Amount of stereo widening applied. The default of 100% corresponds to the original stereo width of the input signal."
                   );
  RegisterParameter(definition,"Pre-delay","ms",-0.0025,0.0025,0.0,1000.0,3.0,1,
                    "Pre-delay applied before the stereo widening.");
  RegisterParameter(definition,"Post-delay","ms",-0.0025,0.0025,0.0,1000.0,3.0,2,
                    "Post-delay applied after the stereo widening.");
  return 3;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Amount", "%", -10.0f, 10.0f, 1.0f, 100.0f, 1.0f, P_AMOUNT, "Amount of stereo widening applied. The default of 100% corresponds to the original stereo width of the input signal.");
        RegisterParameter(definition, "Pre-delay", "ms", -0.0025f, 0.0025f, 0.0f, 1000.0f, 3.0f, P_PREDLY, "Pre-delay applied before the stereo widening.");
        RegisterParameter(definition, "Post-delay", "ms", -0.0025f, 0.0025f, 0.0f, 1000.0f, 3.0f, P_POSTDLY, "Post-delay applied after the stereo widening.");
        return numparams;
    }